

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eimgfs.cpp
# Opt level: O1

void __thiscall XipFile::deletefile(XipFile *this,string *romname)

{
  iterator __position;
  
  __position = std::
               _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
               ::find(&(this->_files)._M_t,romname);
  if ((_Rb_tree_header *)__position._M_node != &(this->_files)._M_t._M_impl.super__Rb_tree_header) {
    (**(code **)(**(long **)(__position._M_node + 2) + 0x38))
              (*(long **)(__position._M_node + 2),this,&this->_mm);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>,_caseinsensitive,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<XipFile::XipEntry>_>_>_>
    ::_M_erase_aux(&(this->_files)._M_t,(const_iterator)__position._M_node);
    clearromhdr(this);
    return;
  }
  printf("deletefile: %s not found\n",(romname->_M_dataplus)._M_p);
  return;
}

Assistant:

virtual void deletefile(const std::string&romname)
    {
        filemap_t::iterator fi= _files.find(romname);
        if (fi==_files.end()) {
            printf("deletefile: %s not found\n", romname.c_str());
            return;
        }
        fi->second->deletefile(*this, _mm);

        _files.erase(fi);
        clearromhdr();
    }